

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser::Parser(Parser *this)

{
  Scanner *this_00;
  Parser *this_local;
  
  tok::tok(&this->curr);
  std::vector<Predicate_*,_std::allocator<Predicate_*>_>::vector(&this->predList);
  std::vector<tok,_std::allocator<tok>_>::vector(&this->toks);
  __gnu_cxx::__normal_iterator<tok_*,_std::vector<tok,_std::allocator<tok>_>_>::__normal_iterator
            (&this->it);
  this_00 = (Scanner *)operator_new(0x48);
  memset(this_00,0,0x48);
  Scanner::Scanner(this_00);
  this->s = this_00;
  return;
}

Assistant:

Parser::Parser()
{
	s = new Scanner();
}